

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O3

spv_result_t spvtools::val::TypePass(ValidationState_t *_,Instruction *inst)

{
  pointer ppVar1;
  bool bVar2;
  ushort uVar3;
  int32_t iVar4;
  uint uVar5;
  StorageClass SVar6;
  StorageClass SVar7;
  Instruction *pIVar8;
  DiagnosticStream *pDVar9;
  const_iterator cVar10;
  pointer puVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  long lVar15;
  __hashtable *__h_1;
  mapped_type mVar16;
  spv_result_t sVar17;
  char *pcVar18;
  Op opcode;
  undefined1 *puVar19;
  ulong uVar20;
  size_t sVar21;
  uint16_t uVar22;
  size_t index;
  pointer ppVar23;
  _Rb_tree_header *p_Var24;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  built_in_members;
  vector<unsigned_int,_std::allocator<unsigned_int>_> const_inst;
  int64_t length_value;
  __node_gen_type __node_gen;
  undefined1 local_288 [32];
  float local_268;
  size_t local_260;
  __node_base_ptr p_Stack_258;
  uint local_24c;
  string local_248;
  string local_228;
  undefined1 local_208 [16];
  _Manager_type local_1f8;
  _Invoker_type local_1f0;
  _Rb_tree_color local_1e8;
  spv_result_t local_38;
  
  iVar4 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode);
  if ((iVar4 == 0) && ((inst->inst_).opcode != 0x27)) {
    return SPV_SUCCESS;
  }
  bVar2 = EnumSet<spvtools::Extension>::contains
                    (&_->module_extensions_,kSPV_VALIDATOR_ignore_type_decl_unique);
  if (bVar2) {
LAB_001fe4c3:
    uVar22 = (inst->inst_).opcode;
  }
  else {
    uVar22 = (inst->inst_).opcode;
    if (((0x20 < (ulong)uVar22) || ((0x170000000U >> ((ulong)uVar22 & 0x3f) & 1) == 0)) &&
       (uVar22 != OpTypeUntypedPointerKHR)) {
      bVar2 = ValidationState_t::RegisterUniqueTypeDeclaration(_,inst);
      if (!bVar2) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "Duplicate non-aggregate type declarations are not allowed. Opcode: ",0x43);
        local_288._0_8_ = spvOpcodeString((uint)uVar22);
        pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)local_288);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar9," id: ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar9);
        sVar17 = pDVar9->error_;
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        if (sVar17 != SPV_SUCCESS) {
          return sVar17;
        }
      }
      goto LAB_001fe4c3;
    }
  }
  if (0x1140 < uVar22) {
    if (uVar22 != 0x1141) {
      if ((uVar22 != 0x1168) && (uVar22 != 0x14ee)) {
        return SPV_SUCCESS;
      }
      uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar8 = ValidationState_t::FindDef(_,uVar5);
      if ((pIVar8 == (Instruction *)0x0) || (1 < (pIVar8->inst_).opcode - 0x15)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"OpTypeCooperativeMatrix Component Type <id> ",0x2c);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
        pcVar18 = " is not a scalar numerical type.";
        lVar15 = 0x20;
        goto LAB_001ff1ad;
      }
      uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar8 = ValidationState_t::FindDef(_,uVar5);
      if (((pIVar8 == (Instruction *)0x0) ||
          (bVar2 = ValidationState_t::IsIntScalarType(_,(pIVar8->inst_).type_id), !bVar2)) ||
         (iVar4 = spvOpcodeIsConstant((uint)(pIVar8->inst_).opcode), iVar4 == 0)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar18 = "OpTypeCooperativeMatrix Scope <id> ";
        lVar15 = 0x23;
      }
      else {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,3);
        pIVar8 = ValidationState_t::FindDef(_,uVar5);
        if (((pIVar8 == (Instruction *)0x0) ||
            (bVar2 = ValidationState_t::IsIntScalarType(_,(pIVar8->inst_).type_id), !bVar2)) ||
           (iVar4 = spvOpcodeIsConstant((uint)(pIVar8->inst_).opcode), iVar4 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar18 = "OpTypeCooperativeMatrix Rows <id> ";
        }
        else {
          uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,4);
          pIVar8 = ValidationState_t::FindDef(_,uVar5);
          if (((pIVar8 != (Instruction *)0x0) &&
              (bVar2 = ValidationState_t::IsIntScalarType(_,(pIVar8->inst_).type_id), bVar2)) &&
             (iVar4 = spvOpcodeIsConstant((uint)(pIVar8->inst_).opcode), iVar4 != 0)) {
            if ((inst->inst_).opcode != 0x1168) {
              return SPV_SUCCESS;
            }
            uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,5);
            pIVar8 = ValidationState_t::FindDef(_,uVar5);
            if (((pIVar8 != (Instruction *)0x0) &&
                (bVar2 = ValidationState_t::IsIntScalarType(_,(pIVar8->inst_).type_id), bVar2)) &&
               (iVar4 = spvOpcodeIsConstant((uint)(pIVar8->inst_).opcode), iVar4 != 0)) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar18 = "OpTypeCooperativeMatrixKHR Use <id> ";
            lVar15 = 0x24;
            goto LAB_001ff20a;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar18 = "OpTypeCooperativeMatrix Cols <id> ";
        }
        lVar15 = 0x22;
      }
LAB_001ff20a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar15);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
      pcVar18 = " is not a constant instruction with scalar integer type.";
      lVar15 = 0x38;
      goto LAB_001ff1ad;
    }
    bVar2 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar2) {
      return SPV_SUCCESS;
    }
    SVar7 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
    if ((int)SVar7 < 9) {
      if (SVar7 == Uniform) {
        return SPV_SUCCESS;
      }
      if (SVar7 == Workgroup) {
        bVar2 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityWorkgroupMemoryExplicitLayoutKHR);
        if (bVar2) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar18 = 
        "Workgroup storage class untyped pointers in Vulkan require WorkgroupMemoryExplicitLayoutKHR be declared"
        ;
        lVar15 = 0x67;
        goto LAB_001ffd06;
      }
    }
    else {
      if (SVar7 == PushConstant) {
        return SPV_SUCCESS;
      }
      if (SVar7 == StorageBuffer) {
        return SPV_SUCCESS;
      }
      if (SVar7 == PhysicalStorageBuffer) {
        return SPV_SUCCESS;
      }
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar18 = "In Vulkan, untyped pointers can only be used in an explicitly laid out storage class"
    ;
LAB_001ffd01:
    lVar15 = 0x54;
    goto LAB_001ffd06;
  }
  switch(uVar22) {
  case 0x15:
    uVar5 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    switch(uVar5 << 0x1d | uVar5 - 8 >> 3) {
    case 0:
      if ((_->features_).declare_int8_type != false) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar18 = 
      "Using an 8-bit integer type requires the Int8 capability, or an extension that explicitly enables 8-bit integers."
      ;
      lVar15 = 0x71;
      break;
    case 1:
      if ((_->features_).declare_int16_type != false) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar18 = 
      "Using a 16-bit integer type requires the Int16 capability, or an extension that explicitly enables 16-bit integers."
      ;
      lVar15 = 0x73;
      break;
    default:
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Invalid number of bits (",0x18);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      pcVar18 = ") used for OpTypeInt.";
      lVar15 = 0x15;
      break;
    case 3:
      uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      if (uVar5 < 2) {
        if ((inst->inst_).opcode != 0x15) {
          return SPV_SUCCESS;
        }
        bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
        if (!bVar2) {
          return SPV_SUCCESS;
        }
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        if (uVar5 == 0) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_BINARY,inst);
        pcVar18 = "The Signedness in OpTypeInt must always be 0 when Kernel capability is used.";
        lVar15 = 0x4c;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_VALUE,inst);
        pcVar18 = "OpTypeInt has invalid signedness:";
        lVar15 = 0x21;
      }
      break;
    case 7:
      bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityInt64);
      if (bVar2) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar18 = "Using a 64-bit integer type requires the Int64 capability.";
      lVar15 = 0x3a;
    }
    break;
  case 0x16:
    uVar5 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    if (uVar5 == 0x40) {
      bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityFloat64);
      if (bVar2) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Using a 64-bit floating point ",0x1e);
      pcVar18 = "type requires the Float64 capability.";
      lVar15 = 0x25;
    }
    else {
      if (uVar5 == 0x20) {
        return SPV_SUCCESS;
      }
      if (uVar5 == 0x10) {
        if ((_->features_).declare_float16_type != false) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Using a 16-bit floating point ",0x1e);
        pcVar18 = 
        "type requires the Float16 or Float16Buffer capability, or an extension that explicitly enables 16-bit floating point."
        ;
        lVar15 = 0x75;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Invalid number of bits (",0x18);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        pcVar18 = ") used for OpTypeFloat.";
        lVar15 = 0x17;
      }
    }
    break;
  case 0x17:
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    if ((pIVar8 == (Instruction *)0x0) ||
       (iVar4 = spvOpcodeIsScalarType((uint)(pIVar8->inst_).opcode), iVar4 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpTypeVector Component Type <id> ",0x21);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
      pcVar18 = " is not a scalar type.";
LAB_001ff14c:
      lVar15 = 0x16;
      goto LAB_001ff1ad;
    }
    uVar5 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
    if (uVar5 - 2 < 3) {
      return SPV_SUCCESS;
    }
    if ((uVar5 == 0x10) || (uVar5 == 8)) {
      bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityVector16);
      if (bVar2) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Having ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," components for ",0x10);
      local_288._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
      pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)local_288);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar9," requires the Vector16 capability",0x21);
      sVar17 = pDVar9->error_;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Illegal number of components (",0x1e);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,") for ",6);
      local_288._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
      pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)local_288);
      sVar17 = pDVar9->error_;
    }
    goto LAB_001ffd18;
  case 0x18:
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    if ((pIVar8 == (Instruction *)0x0) || ((pIVar8->inst_).opcode != 0x17)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "Columns in a matrix must be of type vector.";
      lVar15 = 0x2b;
    }
    else {
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar8,1);
      pIVar8 = ValidationState_t::FindDef(_,uVar5);
      if ((pIVar8->inst_).opcode == 0x16) {
        uVar5 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
        if (0xfffffffc < uVar5 - 5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar18 = "Matrix types can only be parameterized as having only 2, 3, or 4 columns.";
        lVar15 = 0x49;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar18 = "Matrix types can only be parameterized with floating-point types.";
        lVar15 = 0x41;
      }
    }
    break;
  default:
    goto LAB_001ffd23;
  case 0x1c:
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    if ((pIVar8 == (Instruction *)0x0) ||
       (iVar4 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode), iVar4 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpTypeArray Element Type <id> ";
      lVar15 = 0x1e;
LAB_001ff17a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar15);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
      pcVar18 = " is not a type.";
      lVar15 = 0xf;
      goto LAB_001ff1ad;
    }
    if ((pIVar8->inst_).opcode == 0x13) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpTypeArray Element Type <id> ";
      lVar15 = 0x1e;
LAB_001febf6:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar15);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
      pcVar18 = " is a void type.";
      lVar15 = 0x10;
      goto LAB_001ff1ad;
    }
    bVar2 = spvIsVulkanEnv(_->context_->target_env);
    if ((bVar2) && ((pIVar8->inst_).opcode == 0x1d)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)local_288,_,0x1248,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
      pcVar18 = "OpTypeArray Element Type <id> ";
      lVar15 = 0x1e;
      goto LAB_001ff7b3;
    }
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    if ((pIVar8 == (Instruction *)0x0) ||
       (iVar4 = spvOpcodeIsConstant((uint)(pIVar8->inst_).opcode), iVar4 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpTypeArray Length <id> ",0x18);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
      pcVar18 = " is not a scalar constant type.";
      lVar15 = 0x1f;
      goto LAB_002000e0;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_248,&pIVar8->words_);
    pIVar8 = ValidationState_t::FindDef(_,*(uint32_t *)(local_248._M_dataplus._M_p + 4));
    if ((pIVar8 == (Instruction *)0x0) || ((pIVar8->inst_).opcode != 0x15)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpTypeArray Length <id> ",0x18);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," is not a constant integer type.",0x20);
LAB_001fffeb:
      if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
        operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      sVar17 = local_38;
    }
    else {
      bVar2 = ValidationState_t::EvalConstantValInt64(_,uVar5,(int64_t *)&local_228);
      sVar17 = SPV_SUCCESS;
      if ((bVar2) &&
         ((CONCAT44(local_228._M_dataplus._M_p._4_4_,(_Rb_tree_color)local_228._M_dataplus._M_p) ==
           0 || ((local_228._M_dataplus._M_p._4_4_ < 0 &&
                 ((pIVar8->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[3] != 0)))))) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"OpTypeArray Length <id> ",0x18);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," default value must be at least 1: found ",0x29);
        std::ostream::_M_insert<long>((long)local_208);
        goto LAB_001fffeb;
      }
    }
    if (local_248._M_dataplus._M_p != (char *)0x0) {
      operator_delete(local_248._M_dataplus._M_p,
                      local_248.field_2._M_allocated_capacity - (long)local_248._M_dataplus._M_p);
    }
    goto LAB_001ffd1d;
  case 0x1d:
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    if ((pIVar8 == (Instruction *)0x0) ||
       (iVar4 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode), iVar4 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpTypeRuntimeArray Element Type <id> ";
      lVar15 = 0x25;
      goto LAB_001ff17a;
    }
    if ((pIVar8->inst_).opcode == 0x13) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpTypeRuntimeArray Element Type <id> ";
      lVar15 = 0x25;
      goto LAB_001febf6;
    }
    bVar2 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar2) {
      return SPV_SUCCESS;
    }
    if ((pIVar8->inst_).opcode != 0x1d) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)local_288,_,0x1248,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
    pcVar18 = "OpTypeRuntimeArray Element Type <id> ";
    lVar15 = 0x25;
LAB_001ff7b3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar15);
    ValidationState_t::getIdName_abi_cxx11_(&local_248,_,uVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208," is not valid in ",0x11);
    spvLogStringForEnv_abi_cxx11_(&local_228,_->context_->target_env);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                (_Rb_tree_color)local_228._M_dataplus._M_p),
               local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," environments.",0xe);
    puVar19 = (undefined1 *)
              CONCAT44(local_228._M_dataplus._M_p._4_4_,(_Rb_tree_color)local_228._M_dataplus._M_p);
    sVar17 = local_38;
LAB_001fff48:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar19 != &local_228.field_2) {
      operator_delete(puVar19,local_228.field_2._M_allocated_capacity + 1);
    }
LAB_001fff68:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    goto LAB_001ff1c4;
  case 0x1e:
    local_24c = Instruction::GetOperandAs<unsigned_int>(inst,0);
    if (0x10 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      sVar21 = 1;
      do {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,sVar21);
        if (uVar5 == (inst->inst_).result_id) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar18 = "Structure members may not be self references";
          lVar15 = 0x2c;
          goto LAB_001ffd06;
        }
        pIVar8 = ValidationState_t::FindDef(_,uVar5);
        if ((pIVar8 == (Instruction *)0x0) ||
           (iVar4 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode), iVar4 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpTypeStruct Member Type <id> ",0x1e);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
          pcVar18 = " is not a type.";
          lVar15 = 0xf;
          goto LAB_002000e0;
        }
        uVar22 = (pIVar8->inst_).opcode;
        if (uVar22 == 0x1e) {
          local_208._0_4_ = uVar5;
          cVar10 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(_->builtin_structs_)._M_h,(key_type_conflict *)local_208);
          if (cVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Structure <id> ",0xf);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,
                       " contains members with BuiltIn decoration. Therefore this ",0x3a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"structure may not be contained as a member of another "
                       ,0x36);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"structure ",10)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"type. Structure <id> ",0x15);
            ValidationState_t::getIdName_abi_cxx11_(&local_248,_,local_24c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," contains structure <id> ",0x19);
            ValidationState_t::getIdName_abi_cxx11_(&local_228,_,uVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,
                       (char *)CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                        (_Rb_tree_color)local_228._M_dataplus._M_p),
                       local_228._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
            puVar19 = (undefined1 *)
                      CONCAT44(local_228._M_dataplus._M_p._4_4_,
                               (_Rb_tree_color)local_228._M_dataplus._M_p);
            sVar17 = local_38;
            goto LAB_001fff48;
          }
        }
        else if (uVar22 == 0x13) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar18 = "Structures cannot contain a void type.";
          lVar15 = 0x26;
          goto LAB_001ffd06;
        }
        bVar2 = spvIsVulkanEnv(_->context_->target_env);
        if ((bVar2) && ((pIVar8->inst_).opcode == 0x1d)) {
          if (sVar21 == ((long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
            bVar2 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block);
            if ((bVar2) ||
               (bVar2 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock),
               bVar2)) goto LAB_001fef3b;
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)local_288,_,0x1248,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
            spvLogStringForEnv_abi_cxx11_(&local_248,_->context_->target_env);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,", OpTypeStruct containing an OpTypeRuntimeArray ",0x30)
            ;
            pcVar18 = "must be decorated with Block or BufferBlock.";
            lVar15 = 0x2c;
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)local_288,_,0x1248,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"In ",3);
            spvLogStringForEnv_abi_cxx11_(&local_248,_->context_->target_env);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
            pcVar18 = 
            ", OpTypeRuntimeArray must only be used for the last member of an OpTypeStruct";
            lVar15 = 0x4d;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar15);
          sVar17 = local_38;
          goto LAB_001fff68;
        }
LAB_001fef3b:
        sVar21 = sVar21 + 1;
      } while (sVar21 < (ulong)((long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    puVar11 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar11) < 9) {
      mVar16 = false;
    }
    else {
      uVar20 = 2;
      mVar16 = false;
      do {
        pIVar8 = ValidationState_t::FindDef(_,puVar11[uVar20]);
        if ((pIVar8 != (Instruction *)0x0) && ((pIVar8->inst_).opcode == 0x1e)) {
          bVar2 = ValidationState_t::HasDecoration(_,(pIVar8->inst_).result_id,Block);
          if ((!bVar2) &&
             (bVar2 = ValidationState_t::HasDecoration(_,(pIVar8->inst_).result_id,BufferBlock),
             !bVar2)) {
            local_208._0_4_ = (pIVar8->inst_).result_id;
            pmVar12 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&_->struct_has_nested_blockorbufferblock_struct_,
                                   (key_type *)local_208);
            if (*pmVar12 != true) goto LAB_001fefde;
          }
          mVar16 = true;
        }
LAB_001fefde:
        uVar20 = uVar20 + 1;
        puVar11 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar20 < (ulong)((long)(inst->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >>
                               2));
    }
    local_208._0_4_ = (inst->inst_).result_id;
    pmVar12 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&_->struct_has_nested_blockorbufferblock_struct_,(key_type *)local_208
                          );
    *pmVar12 = mVar16;
    local_208._0_4_ = (inst->inst_).result_id;
    pmVar12 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&_->struct_has_nested_blockorbufferblock_struct_,(key_type *)local_208
                          );
    if ((*pmVar12 != false) &&
       ((bVar2 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock), bVar2 ||
        (bVar2 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block), bVar2)))) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = 
      "rules: A Block or BufferBlock cannot be nested within another Block or BufferBlock. ";
      goto LAB_001ffd01;
    }
    local_288._0_8_ = &p_Stack_258;
    local_288._8_8_ = 1;
    local_288._16_8_ = 0;
    local_288._24_8_ = 0;
    local_268 = 1.0;
    local_260 = 0;
    p_Stack_258 = (__node_base_ptr)0x0;
    local_208._0_4_ = local_24c;
    pmVar13 = std::
              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
              ::operator[](&_->id_decorations_,(key_type_conflict *)local_208);
    p_Var14 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var24 = &(pmVar13->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var14 != p_Var24) {
      do {
        local_208._0_4_ = p_Var14[1]._M_color;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_208 + 8),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var14[1]._M_parent);
        local_1e8 = p_Var14[2]._M_color;
        if ((local_208._0_4_ == 0xb) && (local_1e8 != ~_S_red)) {
          local_248._M_dataplus._M_p = local_288;
          local_228._M_dataplus._M_p._0_4_ = local_1e8;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_288,&local_228,&local_248);
        }
        if ((void *)local_208._8_8_ != (void *)0x0) {
          operator_delete((void *)local_208._8_8_,(long)local_1f0 - local_208._8_8_);
        }
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      } while ((_Rb_tree_header *)p_Var14 != p_Var24);
    }
    if (((int)local_288._24_4_ < 1) ||
       ((int)((ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1 == local_288._24_4_
       )) {
      if (0 < (int)local_288._24_4_) {
        local_248._M_dataplus._M_p._0_4_ = local_24c;
        local_208._0_8_ = &_->builtin_structs_;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ();
      }
      bVar2 = spvIsVulkanEnv(_->context_->target_env);
      sVar17 = SPV_SUCCESS;
      if ((bVar2) && (_->options_->before_hlsl_legalization == false)) {
        local_208._8_8_ = (void *)0x0;
        local_1f0 = std::
                    _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_type.cpp:383:29)>
                    ::_M_invoke;
        local_1f8 = std::
                    _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_type.cpp:383:29)>
                    ::_M_manager;
        local_208._0_8_ = _;
        bVar2 = ValidationState_t::ContainsType
                          (_,(inst->inst_).result_id,
                           (function<bool_(const_spvtools::val::Instruction_*)> *)local_208,true);
        if (local_1f8 != (_Manager_type)0x0) {
          (*local_1f8)((_Any_data *)local_208,(_Any_data *)local_208,__destroy_functor);
        }
        if (bVar2) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_248,_,0x123b,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"In ",3);
          spvLogStringForEnv_abi_cxx11_(&local_228,_->context_->target_env);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     (char *)CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                      (_Rb_tree_color)local_228._M_dataplus._M_p),
                     local_228._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,", OpTypeStruct must not contain an opaque type.",0x2f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_228._M_dataplus._M_p._4_4_,
                          (_Rb_tree_color)local_228._M_dataplus._M_p) != &local_228.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                     (_Rb_tree_color)local_228._M_dataplus._M_p),
                            local_228.field_2._M_allocated_capacity + 1);
          }
          sVar17 = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001ff490;
        }
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "When BuiltIn decoration is applied to a structure-type member, ",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "all members of that structure type must also be decorated with ",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"BuiltIn (No allowed mixing of built-in variables and ",0x35);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "non-built-in variables within a single structure). Structure id ",0x40);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," does not meet this requirement.",0x20);
      sVar17 = local_38;
LAB_001ff490:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_288);
    goto LAB_001ffd1d;
  case 0x20:
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    if ((pIVar8 == (Instruction *)0x0) ||
       (iVar4 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode), iVar4 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpTypePointer Type <id> ";
      lVar15 = 0x18;
      goto LAB_001ff17a;
    }
    SVar7 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
    if (SVar7 == UniformConstant) {
      uVar3 = (pIVar8->inst_).opcode;
      if ((uVar3 & 0xfffe) == 0x1c) {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar8,1);
        pIVar8 = ValidationState_t::FindDef(_,uVar5);
        uVar3 = (pIVar8->inst_).opcode;
      }
      if ((uVar3 == 0x19) && (uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar8,6), uVar5 == 2)
         ) {
        local_288._0_4_ = (inst->inst_).result_id;
        local_208._0_8_ = &_->pointer_to_storage_image_;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ();
      }
    }
    bVar2 = ValidationState_t::IsValidStorageClass(_,SVar7);
    if (bVar2) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_BINARY,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)local_288,_,0x1223,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
    pcVar18 = "Invalid storage class for target environment";
    lVar15 = 0x2c;
    goto LAB_001ff1ad;
  case 0x21:
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    if ((pIVar8 == (Instruction *)0x0) ||
       (iVar4 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode), iVar4 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "OpTypeFunction Return Type <id> ";
      lVar15 = 0x20;
      goto LAB_001ff17a;
    }
    if (0x20 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      sVar21 = 2;
      do {
        index = sVar21;
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,index);
        pIVar8 = ValidationState_t::FindDef(_,uVar5);
        if ((pIVar8 == (Instruction *)0x0) ||
           (iVar4 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode), iVar4 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar18 = "OpTypeFunction Parameter Type <id> ";
          lVar15 = 0x23;
          goto LAB_001ff17a;
        }
        if ((pIVar8->inst_).opcode == 0x13) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpTypeFunction Parameter Type <id> ",0x23);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
          pcVar18 = " cannot be OpTypeVoid.";
          goto LAB_001ff14c;
        }
        sVar21 = index + 1;
      } while (index + 1 <
               (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4));
      if ((ulong)(_->options_->universal_limits_).max_function_args <= index - 2) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"OpTypeFunction may not take more than ",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," arguments. OpTypeFunction <id> ",0x20);
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,0);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,uVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," has ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        pcVar18 = " arguments.";
        lVar15 = 0xb;
LAB_002000e0:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar15);
        sVar17 = local_38;
        goto LAB_001ff1c4;
      }
    }
    ppVar23 = (inst->uses_).
              super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (inst->uses_).
             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (ppVar23 == ppVar1) {
        return SPV_SUCCESS;
      }
      pIVar8 = ppVar23->first;
      opcode = (Op)(pIVar8->inst_).opcode;
      if ((((opcode != OpFunction) && (bVar2 = spvOpcodeIsDebug(opcode), !bVar2)) &&
          (bVar2 = Instruction::IsNonSemantic(pIVar8), !bVar2)) &&
         (bVar2 = spvOpcodeIsDecoration((uint)(pIVar8->inst_).opcode), !bVar2)) break;
      ppVar23 = ppVar23 + 1;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Invalid use of function type result id ",0x27);
    ValidationState_t::getIdName_abi_cxx11_((string *)local_288,_,(inst->inst_).result_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
    pcVar18 = ".";
    lVar15 = 1;
LAB_001ff1ad:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar15);
    sVar17 = local_38;
LAB_001ff1c4:
    if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
    }
    goto LAB_001ffd18;
  case 0x27:
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar8 = ValidationState_t::FindDef(_,uVar5);
    if ((pIVar8->inst_).opcode == 0x20) {
      SVar7 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
      SVar6 = Instruction::GetOperandAs<spv::StorageClass>(pIVar8,1);
      if (SVar7 == SVar6) {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar8,2);
        pIVar8 = ValidationState_t::FindDef(_,uVar5);
        if ((pIVar8 != (Instruction *)0x0) && ((pIVar8->inst_).opcode == 0x1e)) {
          bVar2 = spvIsVulkanEnv(_->context_->target_env);
          if (SVar7 == PhysicalStorageBuffer) {
            return SPV_SUCCESS;
          }
          if (!bVar2) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)local_288,_,0x1267,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_288._0_8_,local_288._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"In Vulkan, OpTypeForwardPointer must have ",0x2a);
          pcVar18 = "a storage class of PhysicalStorageBuffer.";
          lVar15 = 0x29;
          goto LAB_001ff1ad;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar18 = "Forward pointers must point to a structure";
        lVar15 = 0x2a;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Storage class in OpTypeForwardPointer does not match the ",
                   0x39);
        pcVar18 = "pointer definition.";
        lVar15 = 0x13;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar18 = "Pointer type in OpTypeForwardPointer is not a pointer type.";
      lVar15 = 0x3b;
    }
  }
LAB_001ffd06:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar15);
  sVar17 = local_38;
LAB_001ffd18:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_001ffd1d:
  if (sVar17 != SPV_SUCCESS) {
    return sVar17;
  }
LAB_001ffd23:
  return SPV_SUCCESS;
}

Assistant:

spv_result_t TypePass(ValidationState_t& _, const Instruction* inst) {
  if (!spvOpcodeGeneratesType(inst->opcode()) &&
      inst->opcode() != spv::Op::OpTypeForwardPointer) {
    return SPV_SUCCESS;
  }

  if (auto error = ValidateUniqueness(_, inst)) return error;

  switch (inst->opcode()) {
    case spv::Op::OpTypeInt:
      if (auto error = ValidateTypeInt(_, inst)) return error;
      break;
    case spv::Op::OpTypeFloat:
      if (auto error = ValidateTypeFloat(_, inst)) return error;
      break;
    case spv::Op::OpTypeVector:
      if (auto error = ValidateTypeVector(_, inst)) return error;
      break;
    case spv::Op::OpTypeMatrix:
      if (auto error = ValidateTypeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeArray:
      if (auto error = ValidateTypeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeRuntimeArray:
      if (auto error = ValidateTypeRuntimeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeStruct:
      if (auto error = ValidateTypeStruct(_, inst)) return error;
      break;
    case spv::Op::OpTypePointer:
      if (auto error = ValidateTypePointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeFunction:
      if (auto error = ValidateTypeFunction(_, inst)) return error;
      break;
    case spv::Op::OpTypeForwardPointer:
      if (auto error = ValidateTypeForwardPointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      if (auto error = ValidateTypeCooperativeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      if (auto error = ValidateTypeUntypedPointerKHR(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}